

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int pkcs7_wrap(scep *s,int enc_base64)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  OPENSSL_sk_compfunc p_Var5;
  stack_st_X509 *sk;
  OPENSSL_STACK *pOVar6;
  X509 *pXVar7;
  PKCS7 *p7;
  BIO_METHOD *pBVar8;
  ulong uVar9;
  PKCS7 *pPVar10;
  PKCS7_SIGNER_INFO *p7si;
  stack_st_X509_ATTRIBUTE *attrs;
  ASN1_OBJECT *data;
  char *pcVar11;
  EVP_PKEY *local_90;
  EVP_PKEY *signerkey;
  X509 *signercert;
  stack_st_X509_ATTRIBUTE *attributes;
  PKCS7_SIGNER_INFO *si;
  PKCS7 *p7enc;
  stack_st_X509 *recipients;
  int i;
  int len;
  int rc;
  uchar *buffer;
  BIO *base64bio;
  BIO *outbio;
  BIO *memorybio;
  BIO *pkcs7bio;
  BIO *encbio;
  BIO *databio;
  scep *psStack_10;
  int enc_base64_local;
  scep *s_local;
  
  encbio = (BIO *)0x0;
  pkcs7bio = (BIO *)0x0;
  memorybio = (BIO *)0x0;
  outbio = (BIO *)0x0;
  base64bio = (BIO *)0x0;
  buffer = (uchar *)0x0;
  _len = (void *)0x0;
  signerkey = (EVP_PKEY *)0x0;
  local_90 = (EVP_PKEY *)0x0;
  s->sender_nonce_len = 0x10;
  databio._4_4_ = enc_base64;
  psStack_10 = s;
  puVar3 = generate_nonce(s->sender_nonce_len);
  psStack_10->sender_nonce = puVar3;
  uVar1 = psStack_10->request_type - 0x13;
  if (uVar1 < 3 || psStack_10->request_type == 0x16) {
    switch((long)&switchD_0010d60d::switchdataD_00114474 +
           (long)(int)(&switchD_0010d60d::switchdataD_00114474)[uVar1]) {
    case 0x10d60f:
      psStack_10->request_type_str = "19";
      signerkey = (EVP_PKEY *)psStack_10->signercert;
      local_90 = (EVP_PKEY *)psStack_10->signerkey;
      if (d_flag != 0) {
        printf("%s: creating inner PKCS#7\n",pname);
      }
      pBVar8 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar8);
      iVar2 = i2d_X509_REQ_bio((BIO *)encbio,(X509_REQ *)request);
      if (iVar2 < 1) {
        fprintf(_stderr,"%s: error writing certificate request in bio\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      if (d_flag != 0) {
        printf("%s: inner PKCS#7 in mem BIO \n",pname);
      }
      break;
    case 0x10d6ef:
      psStack_10->request_type_str = "20";
      signerkey = (EVP_PKEY *)psStack_10->signercert;
      local_90 = (EVP_PKEY *)psStack_10->signerkey;
      if (d_flag != 0) {
        printf("%s: creating inner PKCS#7\n",pname);
      }
      pBVar8 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar8);
      iVar2 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(encbio,psStack_10->ias_getcertinit);
      if (iVar2 < 1) {
        fprintf(_stderr,"%s: error writing GetCertInitial data in bio\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      break;
    case 0x10d7aa:
      psStack_10->request_type_str = "21";
      signerkey = (EVP_PKEY *)localcert;
      local_90 = (EVP_PKEY *)rsa;
      pBVar8 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar8);
      iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio(encbio,psStack_10->ias_getcert);
      if (iVar2 < 1) {
        fprintf(_stderr,"%s: error writing GetCert data in bio\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      break;
    case 0x10d845:
      psStack_10->request_type_str = "22";
      signerkey = (EVP_PKEY *)localcert;
      local_90 = (EVP_PKEY *)rsa;
      pBVar8 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar8);
      iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio(encbio,psStack_10->ias_getcrl);
      if (iVar2 < 1) {
        fprintf(_stderr,"%s: error writing GetCRL data in bio\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
    }
  }
  lVar4 = BIO_ctrl((BIO *)encbio,0xb,0,(void *)0x0);
  if ((int)lVar4 < 1) {
    fprintf(_stderr,"%s: error flushing databio\n",pname);
  }
  BIO_set_flags((BIO *)encbio,0x200);
  lVar4 = BIO_ctrl((BIO *)encbio,3,0,&psStack_10->request_payload);
  psStack_10->request_len = (int)lVar4;
  if (v_flag != 0) {
    printf("%s: request data dump \n",pname);
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
  }
  if (v_flag != 0) {
    printf("%s: data payload size: %d bytes\n",pname,(ulong)(uint)psStack_10->request_len);
  }
  p_Var5 = ossl_check_X509_compfunc_type((sk_X509_compfunc)0x0);
  sk = (stack_st_X509 *)OPENSSL_sk_new(p_Var5);
  if (sk == (stack_st_X509 *)0x0) {
    fprintf(_stderr,"%s: error creating certificate stack\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (encert == (X509 *)0x0) {
    pOVar6 = ossl_check_X509_sk_type(sk);
    pXVar7 = ossl_check_X509_type(cacert);
    iVar2 = OPENSSL_sk_push(pOVar6,pXVar7);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s: error adding recipient encryption certificate\n",pname);
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
  }
  else {
    pOVar6 = ossl_check_X509_sk_type(sk);
    pXVar7 = ossl_check_X509_type(encert);
    iVar2 = OPENSSL_sk_push(pOVar6,pXVar7);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s: error adding recipient encryption certificate\n",pname);
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
  }
  if (d_flag != 0) {
    printf("\n %s: hexdump request payload\n",pname);
    for (recipients._4_4_ = 0; (int)recipients._4_4_ < psStack_10->request_len;
        recipients._4_4_ = recipients._4_4_ + 1) {
      printf("%02x",(ulong)(uint)(int)psStack_10->request_payload[(int)recipients._4_4_]);
    }
    printf("\n %s: hexdump payload %d \n",pname,(ulong)recipients._4_4_);
  }
  pkcs7bio = (BIO *)BIO_new_mem_buf(psStack_10->request_payload,psStack_10->request_len);
  if ((BIO *)pkcs7bio == (BIO *)0x0) {
    fprintf(_stderr,"%s: error creating data bio\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  p7 = PKCS7_encrypt((stack_st_X509 *)sk,(BIO *)pkcs7bio,(EVP_CIPHER *)enc_alg,0x80);
  if (p7 == (PKCS7 *)0x0) {
    fprintf(_stderr,"%s: request payload encrypt failed\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (v_flag != 0) {
    printf("%s: successfully encrypted payload\n",pname);
  }
  pBVar8 = BIO_s_mem();
  outbio = (BIO *)BIO_new(pBVar8);
  iVar2 = i2d_PKCS7_bio((BIO *)outbio,p7);
  if (iVar2 < 1) {
    fprintf(_stderr,"%s: error writing encrypted data\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  BIO_ctrl((BIO *)outbio,0xb,0,(void *)0x0);
  BIO_set_flags((BIO *)outbio,0x200);
  uVar9 = BIO_ctrl((BIO *)outbio,3,0,&len);
  if (v_flag != 0) {
    printf("%s: envelope size: %d bytes\n",pname,uVar9 & 0xffffffff);
  }
  if (d_flag != 0) {
    printf("%s: printing PEM fomatted PKCS#7\n",pname);
    PEM_write_PKCS7(_stdout,p7);
  }
  BIO_free((BIO *)outbio);
  if (v_flag != 0) {
    printf("%s: creating outer PKCS#7\n",pname);
  }
  pPVar10 = (PKCS7 *)PKCS7_new();
  psStack_10->request_p7 = pPVar10;
  if (psStack_10->request_p7 == (PKCS7 *)0x0) {
    fprintf(_stderr,"%s: failed creating PKCS#7 for signing\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  iVar2 = PKCS7_set_type((PKCS7 *)psStack_10->request_p7,0x16);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s: failed setting PKCS#7 type\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  PKCS7_add_certificate((PKCS7 *)psStack_10->request_p7,(X509 *)signerkey);
  p7si = PKCS7_add_signature((PKCS7 *)psStack_10->request_p7,(X509 *)signerkey,local_90,
                             (EVP_MD *)sig_alg);
  if (p7si != (PKCS7_SIGNER_INFO *)0x0) {
    if (d_flag != 0) {
      printf("%s: signature added successfully\n",pname);
    }
    if (d_flag != 0) {
      printf("%s: adding signed attributes\n",pname);
    }
    attrs = (stack_st_X509_ATTRIBUTE *)OPENSSL_sk_new_null();
    add_attribute_string(attrs,nid_transId,psStack_10->transaction_id);
    add_attribute_string(attrs,nid_messageType,psStack_10->request_type_str);
    add_attribute_octet(attrs,nid_senderNonce,psStack_10->sender_nonce,psStack_10->sender_nonce_len)
    ;
    PKCS7_set_signed_attributes(p7si,(stack_st_X509_ATTRIBUTE *)attrs);
    data = OBJ_nid2obj(0x15);
    iVar2 = PKCS7_add_signed_attribute(p7si,0x32,6,data);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s: error adding NID_pkcs9_contentType\n",pname);
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    iVar2 = PKCS7_content_new((PKCS7 *)psStack_10->request_p7,0x15);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s: failed setting PKCS#7 content type\n",pname);
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    memorybio = (BIO *)PKCS7_dataInit((PKCS7 *)psStack_10->request_p7,(BIO *)0x0);
    if ((BIO *)memorybio != (BIO *)0x0) {
      iVar2 = BIO_write((BIO *)memorybio,_len,(int)uVar9);
      if ((int)uVar9 != iVar2) {
        fprintf(_stderr,"%s: error writing PKCS#7 data\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      if (v_flag != 0) {
        printf("%s: PKCS#7 data written successfully\n",pname);
      }
      iVar2 = PKCS7_dataFinal((PKCS7 *)psStack_10->request_p7,(BIO *)memorybio);
      if (iVar2 != 0) {
        if (d_flag != 0) {
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          PEM_write_PKCS7(_stdout,(PKCS7 *)psStack_10->request_p7);
        }
        if ((v_flag != 0) && (databio._4_4_ != 0)) {
          printf("%s: applying base64 encoding\n",pname);
        }
        pBVar8 = BIO_s_mem();
        outbio = (BIO *)BIO_new(pBVar8);
        pBVar8 = BIO_f_base64();
        buffer = (uchar *)BIO_new(pBVar8);
        if (databio._4_4_ == 0) {
          base64bio = outbio;
        }
        else {
          base64bio = (BIO *)BIO_push((BIO *)buffer,(BIO *)outbio);
        }
        i2d_PKCS7_bio((BIO *)base64bio,(PKCS7 *)psStack_10->request_p7);
        BIO_ctrl((BIO *)base64bio,0xb,0,(void *)0x0);
        BIO_set_flags((BIO *)outbio,0x200);
        lVar4 = BIO_ctrl((BIO *)outbio,3,0,&psStack_10->request_payload);
        psStack_10->request_len = (int)lVar4;
        if (v_flag != 0) {
          pcVar11 = "";
          if (databio._4_4_ != 0) {
            pcVar11 = "base64 encoded ";
          }
          printf("%s: %spayload size: %d bytes\n",pname,pcVar11,(ulong)(uint)psStack_10->request_len
                );
        }
        BIO_free((BIO *)base64bio);
        BIO_free((BIO *)encbio);
        return 0;
      }
      fprintf(_stderr,"%s: error finalizing outer PKCS#7\n",pname);
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    fprintf(_stderr,"%s: error opening bio for writing PKCS#7 data\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  fprintf(_stderr,"%s: error adding PKCS#7 signature\n",pname);
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s, int enc_base64) {
	BIO			*databio = NULL;
	BIO			*encbio = NULL;
	BIO			*pkcs7bio = NULL;
	BIO			*memorybio = NULL;
	BIO			*outbio = NULL;
	BIO			*base64bio = NULL;
	unsigned char		*buffer = NULL;
	int			rc, len = 0;
	int i=0;
	STACK_OF(X509)		*recipients;
	PKCS7			*p7enc;
	PKCS7_SIGNER_INFO	*si;
	STACK_OF(X509_ATTRIBUTE) *attributes;
	X509			*signercert = NULL;
	EVP_PKEY		*signerkey = NULL;

	/* Create a new sender nonce for all messages
	 * XXXXXXXXXXXXXX should it be per transaction? */
	s->sender_nonce_len = 16;
	s->sender_nonce = generate_nonce(s->sender_nonce_len);

	/* Prepare data payload */
	switch(s->request_type) {
		case SCEP_REQUEST_PKCSREQ:
			/*
			 * Set printable message type
			 * We set this later as an autheticated attribute
			 * "messageType".
			 */
			s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read request in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"certificate request in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}else{
				if (d_flag)
					printf("%s: inner PKCS#7 in mem BIO \n", pname);

			}
			break;

		case SCEP_REQUEST_GETCERTINIT:

			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio,
						s->ias_getcertinit)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCertInitial data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCERT:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERT_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcert)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCert data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCRL:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCRL_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcrl)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCRL data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}

			break;
	}


	if( BIO_flush(databio) <= 0 ){
		fprintf(stderr, "%s: error flushing databio\n", pname);
	}
	BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

	/* Below this is the common code for all request_type */

	/* Read in the payload */
	s->request_len = BIO_get_mem_data(databio, &s->request_payload);
	if (v_flag){
		printf("%s: request data dump \n", pname);
		PEM_write_X509_REQ(stdout, request);
	}

	if (v_flag)
		printf("%s: data payload size: %d bytes\n", pname,
				s->request_len);


	/* Create encryption certificate stack */
	if ((recipients = sk_X509_new(NULL)) == NULL) {
		fprintf(stderr, "%s: error creating "
					"certificate stack\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	/*
	 * Use different CA cert for encryption if requested.
	 * encert will be non-NULL if the -e option was specified on the command
	 * line, or if the certificates were auto-selected.
	 */
	if (encert != NULL) {
		if (sk_X509_push(recipients, encert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	/* Use same CA cert also for encryption */
	} else {
		if (sk_X509_push(recipients, cacert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	}

	/* Create BIO for encryption  */
	if (d_flag){
		printf("\n %s: hexdump request payload\n", pname);
		for(i=0; i < s->request_len; i++ ){
			printf("%02x", s->request_payload[i]);
		}
		printf("\n %s: hexdump payload %d \n", pname , i);

	}


	if ((encbio = BIO_new_mem_buf(s->request_payload,
				s->request_len)) == NULL) {
		fprintf(stderr, "%s: error creating data " "bio\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Encrypt */
	if (!(p7enc = PKCS7_encrypt(recipients, encbio,
					enc_alg, PKCS7_BINARY))) {
		fprintf(stderr, "%s: request payload encrypt failed\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: successfully encrypted payload\n", pname);

	/* Write encrypted data */
	memorybio = BIO_new(BIO_s_mem());
	if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
		fprintf(stderr, "%s: error writing encrypted data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	BIO_flush(memorybio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	len = BIO_get_mem_data(memorybio, &buffer);
	if (v_flag)
		printf("%s: envelope size: %d bytes\n", pname, len);
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, p7enc);
	}
	BIO_free(memorybio);

	/* Create outer PKCS#7  */
	if (v_flag)
		printf("%s: creating outer PKCS#7\n", pname);
	s->request_p7 = PKCS7_new();
	if (s->request_p7 == NULL) {
		fprintf(stderr, "%s: failed creating PKCS#7 for signing\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
		fprintf(stderr, "%s: failed setting PKCS#7 type\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Add signer certificate  and signature */
	PKCS7_add_certificate(s->request_p7, signercert);
	if ((si = PKCS7_add_signature(s->request_p7,
				signercert, signerkey, sig_alg)) == NULL) {
		fprintf(stderr, "%s: error adding PKCS#7 signature\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag)
		printf("%s: signature added successfully\n", pname);

	/* Set signed attributes */
	if (d_flag)
		printf("%s: adding signed attributes\n", pname);
	attributes = sk_X509_ATTRIBUTE_new_null();
	add_attribute_string(attributes, nid_transId, s->transaction_id);
	add_attribute_string(attributes, nid_messageType, s->request_type_str);
	add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce,
			s->sender_nonce_len);
	PKCS7_set_signed_attributes(si, attributes);
	/* Add contentType */
	if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType,
			V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
		fprintf(stderr, "%s: error adding NID_pkcs9_contentType\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Create new content */
	if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
		fprintf(stderr, "%s: failed setting PKCS#7 content type\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Write data  */
	pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: error opening bio for writing PKCS#7 "
			"data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (len != BIO_write(pkcs7bio, buffer, len)) {
		fprintf(stderr, "%s: error writing PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 data written successfully\n", pname);

	/* Finalize PKCS#7  */
	if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
		fprintf(stderr, "%s: error finalizing outer PKCS#7\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->request_p7);
	}

	/* base64-encode the data */
	if (v_flag && enc_base64)
		printf("%s: applying base64 encoding\n",pname);

	/* Create base64 filtering bio */
	memorybio = BIO_new(BIO_s_mem());
	base64bio = BIO_new(BIO_f_base64());
	if (enc_base64)
		outbio = BIO_push(base64bio, memorybio);
	else
		outbio = memorybio;

	/* Copy PKCS#7 */
	i2d_PKCS7_bio(outbio, s->request_p7);
	BIO_flush(outbio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
	if (v_flag)
		printf("%s: %spayload size: %d bytes\n",
				pname,
				enc_base64 ? "base64 encoded " : "",
				s->request_len);
	BIO_free(outbio);
	BIO_free(databio);
	return (0);
}